

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_scan_avx2_256_32.c
# Opt level: O2

parasail_result_t *
parasail_nw_table_scan_profile_avx2_256_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  __m256i *palVar1;
  void *pvVar2;
  parasail_matrix_t *ppVar3;
  int *piVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  __m256i alVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  uint uVar14;
  int iVar15;
  int iVar16;
  parasail_result_t *ppVar17;
  __m256i *ptr;
  int32_t *ptr_00;
  __m256i *ptr_01;
  __m256i *ptr_02;
  __m256i *ptr_03;
  int iVar18;
  char *pcVar19;
  uint uVar20;
  ulong uVar21;
  uint uVar22;
  ulong uVar23;
  char *__format;
  long lVar24;
  long lVar25;
  int iVar26;
  ulong size;
  long lVar27;
  int iVar28;
  bool bVar29;
  undefined8 uVar30;
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  __m256i_32_t e;
  __m256i_32_t h;
  long local_108;
  longlong local_a0;
  longlong lStack_98;
  longlong lStack_90;
  longlong lStack_88;
  longlong local_80;
  longlong lStack_78;
  longlong lStack_70;
  longlong lStack_68;
  
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar19 = "profile";
  }
  else {
    pvVar2 = (profile->profile32).score;
    if (pvVar2 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar19 = "profile->profile32.score";
    }
    else {
      ppVar3 = profile->matrix;
      if (ppVar3 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar19 = "profile->matrix";
      }
      else {
        uVar20 = profile->s1Len;
        if ((int)uVar20 < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar19 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar19 = "s2";
        }
        else {
          uVar21 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            __format = "%s: %s must be > 0\n";
            pcVar19 = "s2Len";
          }
          else if (open < 0) {
            __format = "%s: %s must be >= 0\n";
            pcVar19 = "open";
          }
          else {
            if (-1 < gap) {
              uVar14 = uVar20 - 1;
              size = (ulong)uVar20 + 7 >> 3;
              iVar28 = -open;
              iVar15 = ppVar3->min;
              uVar22 = 0x80000000 - iVar15;
              if (iVar15 != iVar28 && SBORROW4(iVar15,iVar28) == iVar15 + open < 0) {
                uVar22 = open | 0x80000000;
              }
              iVar15 = 0x7ffffffe - ppVar3->max;
              ppVar17 = parasail_result_new_table1((uint)((ulong)uVar20 + 7) & 0x7ffffff8,s2Len);
              if (ppVar17 != (parasail_result_t *)0x0) {
                ppVar17->flag = ppVar17->flag | 0x8420401;
                ptr = parasail_memalign___m256i(0x20,size);
                ptr_00 = parasail_memalign_int32_t(0x20,(ulong)(s2Len + 1));
                ptr_01 = parasail_memalign___m256i(0x20,size);
                ptr_02 = parasail_memalign___m256i(0x20,size);
                ptr_03 = parasail_memalign___m256i(0x20,size);
                if (ptr_03 != (__m256i *)0x0 &&
                    ((ptr_02 != (__m256i *)0x0 && ptr_01 != (__m256i *)0x0) &&
                    (ptr_00 != (int32_t *)0x0 && ptr != (__m256i *)0x0))) {
                  iVar16 = s2Len + -1;
                  auVar33._4_4_ = open;
                  auVar33._0_4_ = open;
                  auVar33._8_4_ = open;
                  auVar33._12_4_ = open;
                  auVar33._16_4_ = open;
                  auVar33._20_4_ = open;
                  auVar33._24_4_ = open;
                  auVar33._28_4_ = open;
                  auVar34._4_4_ = gap;
                  auVar34._0_4_ = gap;
                  auVar34._8_4_ = gap;
                  auVar34._12_4_ = gap;
                  auVar34._16_4_ = gap;
                  auVar34._20_4_ = gap;
                  auVar34._24_4_ = gap;
                  auVar34._28_4_ = gap;
                  iVar18 = uVar22 + 1;
                  auVar31._4_4_ = iVar18;
                  auVar31._0_4_ = iVar18;
                  auVar31._8_4_ = iVar18;
                  auVar31._12_4_ = iVar18;
                  auVar31._16_4_ = iVar18;
                  auVar31._20_4_ = iVar18;
                  auVar31._24_4_ = iVar18;
                  auVar31._28_4_ = iVar18;
                  auVar32._4_4_ = iVar15;
                  auVar32._0_4_ = iVar15;
                  auVar32._8_4_ = iVar15;
                  auVar32._12_4_ = iVar15;
                  auVar32._16_4_ = iVar15;
                  auVar32._20_4_ = iVar15;
                  auVar32._24_4_ = iVar15;
                  auVar32._28_4_ = iVar15;
                  iVar26 = (int)size;
                  iVar15 = -(iVar26 * gap);
                  auVar36._4_4_ = iVar15;
                  auVar36._0_4_ = iVar15;
                  auVar36._8_4_ = iVar15;
                  auVar36._12_4_ = iVar15;
                  auVar36._16_4_ = iVar15;
                  auVar36._20_4_ = iVar15;
                  auVar36._24_4_ = iVar15;
                  auVar36._28_4_ = iVar15;
                  auVar36 = vpblendd_avx2(auVar36,SUB6432(ZEXT1664((undefined1  [16])0x0),0),1);
                  auVar35 = ZEXT1232(CONCAT84(SUB128(ZEXT812(0),4),iVar18));
                  auVar36 = vpaddd_avx2(auVar35,auVar36);
                  iVar15 = iVar28;
                  for (uVar23 = 0; uVar23 != size; uVar23 = uVar23 + 1) {
                    iVar18 = iVar15;
                    for (lVar24 = 0; lVar24 != 8; lVar24 = lVar24 + 1) {
                      lVar25 = (long)iVar18 - (ulong)(uint)open;
                      if (lVar25 < -0x7fffffff) {
                        lVar25 = -0x80000000;
                      }
                      *(int *)((long)&local_80 + lVar24 * 4) = iVar18;
                      *(int *)((long)&local_a0 + lVar24 * 4) = (int)lVar25;
                      iVar18 = iVar18 - iVar26 * gap;
                    }
                    palVar1 = ptr_02 + uVar23;
                    (*palVar1)[0] = local_80;
                    (*palVar1)[1] = lStack_78;
                    (*palVar1)[2] = lStack_70;
                    (*palVar1)[3] = lStack_68;
                    palVar1 = ptr + uVar23;
                    (*palVar1)[0] = local_a0;
                    (*palVar1)[1] = lStack_98;
                    (*palVar1)[2] = lStack_90;
                    (*palVar1)[3] = lStack_88;
                    iVar15 = iVar15 - gap;
                  }
                  *ptr_00 = 0;
                  for (uVar23 = 1; s2Len + 1 != uVar23; uVar23 = uVar23 + 1) {
                    ptr_00[uVar23] = iVar28;
                    iVar28 = iVar28 - gap;
                  }
                  alVar9 = (__m256i)vpsubd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar33);
                  for (uVar20 = iVar26 - 1U; -1 < (int)uVar20; uVar20 = uVar20 - 1) {
                    ptr_03[uVar20] = alVar9;
                    alVar9 = (__m256i)vpsubd_avx2((undefined1  [32])alVar9,auVar34);
                  }
                  lVar24 = size * uVar21;
                  local_108 = 0;
                  auVar8 = vpmovsxbd_avx2(ZEXT816(0x605040302010000));
                  auVar37 = ZEXT3264(auVar32);
                  auVar38 = ZEXT3264(auVar31);
                  uVar23 = 0;
                  while (uVar23 != uVar21) {
                    auVar13 = vpermd_avx2(auVar8,(undefined1  [32])ptr_02[iVar26 - 1U]);
                    auVar13 = vpblendd_avx2(auVar13,ZEXT432((uint)ptr_00[uVar23]),1);
                    iVar15 = ppVar3->mapper[(byte)s2[uVar23]];
                    auVar10 = vpsubd_avx2(auVar31,(undefined1  [32])*ptr_03);
                    auVar7 = auVar31;
                    for (lVar25 = 0; size << 5 != lVar25; lVar25 = lVar25 + 0x20) {
                      auVar6 = vpaddd_avx2(auVar13,*(undefined1 (*) [32])
                                                    ((long)pvVar2 +
                                                    lVar25 + (long)(iVar15 * iVar26) * 0x20));
                      auVar13 = *(undefined1 (*) [32])((long)*ptr_02 + lVar25);
                      auVar11 = vpsubd_avx2(*(undefined1 (*) [32])((long)*ptr + lVar25),auVar34);
                      auVar12 = vpsubd_avx2(auVar13,auVar33);
                      auVar10 = vpaddd_avx2(auVar10,*(undefined1 (*) [32])((long)*ptr_03 + lVar25));
                      auVar11 = vpmaxsd_avx2(auVar11,auVar12);
                      auVar7 = vpmaxsd_avx2(auVar7,auVar10);
                      *(undefined1 (*) [32])((long)*ptr + lVar25) = auVar11;
                      auVar10 = vpmaxsd_avx2(auVar11,auVar6);
                      *(undefined1 (*) [32])((long)*ptr_01 + lVar25) = auVar10;
                    }
                    auVar13 = vpermd_avx2(auVar8,auVar10);
                    lVar25 = uVar23 + 1;
                    uVar23 = uVar23 + 1;
                    auVar10 = vpblendd_avx2(auVar13,ZEXT432((uint)ptr_00[lVar25]),1);
                    auVar13 = vpaddd_avx2(auVar10,(undefined1  [32])*ptr_03);
                    auVar13 = vpmaxsd_avx2(auVar7,auVar13);
                    iVar15 = 6;
                    while( true ) {
                      auVar7 = vperm2i128_avx2(auVar13,auVar13,8);
                      auVar7 = vpalignr_avx2(auVar13,auVar7,0xc);
                      bVar29 = iVar15 == 0;
                      iVar15 = iVar15 + -1;
                      if (bVar29) break;
                      auVar7 = vpaddd_avx2(auVar7,auVar36);
                      auVar13 = vpmaxsd_avx2(auVar13,auVar7);
                    }
                    auVar13 = vpaddd_avx2(auVar7,auVar35);
                    auVar7 = vpmaxsd_avx2(auVar10,auVar13);
                    lVar25 = local_108;
                    for (lVar27 = 0; size << 5 != lVar27; lVar27 = lVar27 + 0x20) {
                      auVar13 = vpsubd_avx2(auVar13,auVar34);
                      auVar7 = vpsubd_avx2(auVar7,auVar33);
                      auVar13 = vpmaxsd_avx2(auVar13,auVar7);
                      auVar7 = vpmaxsd_avx2(auVar13,*(undefined1 (*) [32])((long)*ptr_01 + lVar27));
                      *(undefined1 (*) [32])((long)*ptr_02 + lVar27) = auVar7;
                      piVar4 = ((ppVar17->field_4).rowcols)->score_row;
                      *(int *)((long)piVar4 + lVar25) = auVar7._0_4_;
                      *(int *)((long)piVar4 + lVar24 * 4 + lVar25) = auVar7._4_4_;
                      *(int *)((long)piVar4 + lVar24 * 8 + lVar25) = auVar7._8_4_;
                      *(int *)((long)piVar4 + lVar24 * 0xc + lVar25) = auVar7._12_4_;
                      *(int *)((long)piVar4 + lVar24 * 0x10 + lVar25) = auVar7._16_4_;
                      *(int *)((long)piVar4 + lVar24 * 0x14 + lVar25) = auVar7._20_4_;
                      *(int *)((long)piVar4 + lVar24 * 0x18 + lVar25) = auVar7._24_4_;
                      *(int *)((long)piVar4 + lVar24 * 0x1c + lVar25) = auVar7._28_4_;
                      auVar10 = vpminsd_avx2(auVar37._0_32_,auVar7);
                      auVar37 = ZEXT3264(auVar10);
                      auVar10 = vpmaxsd_avx2(auVar38._0_32_,auVar7);
                      auVar38 = ZEXT3264(auVar10);
                      lVar25 = lVar25 + uVar21 * 4;
                    }
                    local_108 = local_108 + 4;
                  }
                  alVar9 = ptr_02[(ulong)uVar14 % size];
                  for (iVar15 = 0; iVar15 < 7 - (int)(uVar14 / size); iVar15 = iVar15 + 1) {
                    auVar36 = vperm2i128_avx2((undefined1  [32])alVar9,(undefined1  [32])alVar9,0x28
                                             );
                    alVar9 = (__m256i)vpalignr_avx2((undefined1  [32])alVar9,auVar36,0xc);
                  }
                  auVar36 = vpcmpgtd_avx2(auVar31,auVar37._0_32_);
                  auVar31 = vpcmpgtd_avx2(auVar38._0_32_,auVar32);
                  auVar36 = vpor_avx2(auVar31,auVar36);
                  if ((((((((auVar36 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar36 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar36 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar36 >> 0x7f,0) == '\0') &&
                        (auVar36 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar36 >> 0xbf,0) == '\0') &&
                      (auVar36 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar36[0x1f]) {
                    auVar36 = vpermq_avx2((undefined1  [32])alVar9,0xff);
                    auVar5 = vpshufd_avx(auVar36._0_16_,0x55);
                    auVar5 = vpinsrd_avx(auVar5,uVar14,1);
                    uVar30 = auVar5._0_8_;
                  }
                  else {
                    *(byte *)&ppVar17->flag = (byte)ppVar17->flag | 0x40;
                    uVar30 = 0;
                    iVar16 = 0;
                  }
                  ppVar17->score = (int)uVar30;
                  ppVar17->end_query = (int)((ulong)uVar30 >> 0x20);
                  ppVar17->end_ref = iVar16;
                  parasail_free(ptr_03);
                  parasail_free(ptr_02);
                  parasail_free(ptr_01);
                  parasail_free(ptr_00);
                  parasail_free(ptr);
                  return ppVar17;
                }
              }
              return (parasail_result_t *)0x0;
            }
            __format = "%s: %s must be >= 0\n";
            pcVar19 = "gap";
          }
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_nw_table_scan_profile_avx2_256_32",pcVar19);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m256i* restrict pvP = NULL;
    __m256i* restrict pvE = NULL;
    int32_t* restrict boundary = NULL;
    __m256i* restrict pvHt = NULL;
    __m256i* restrict pvH = NULL;
    __m256i* restrict pvGapper = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    __m256i vZero;
    int32_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vNegInfFront;
    __m256i vSegLenXgap;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP = (__m256i*)profile->profile32.score;
    vGapO = _mm256_set1_epi32(open);
    vGapE = _mm256_set1_epi32(gap);
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    vZero = _mm256_setzero_si256();
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInfFront = vZero;
    vNegInfFront = _mm256_insert_epi32_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm256_add_epi32(vNegInfFront,
            _mm256_slli_si256_rpl(_mm256_set1_epi32(-segLen*gap), 4));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE = parasail_memalign___m256i(32, segLen);
    boundary = parasail_memalign_int32_t(32, s2Len+1);
    pvHt= parasail_memalign___m256i(32, segLen);
    pvH = parasail_memalign___m256i(32, segLen);
    pvGapper = parasail_memalign___m256i(32, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!boundary) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvGapper) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m256i_32_t h;
            __m256i_32_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
            }
            _mm256_store_si256(&pvH[index], h.m);
            _mm256_store_si256(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT32_MIN ? INT32_MIN : tmp;
        }
    }

    {
        __m256i vGapper = _mm256_sub_epi32(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm256_store_si256(pvGapper+i, vGapper);
            vGapper = _mm256_sub_epi32(vGapper, vGapE);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vHt;
        __m256i vF;
        __m256i vH;
        __m256i vHp;
        __m256i *pvW;
        __m256i vW;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm256_load_si256(pvH+(segLen-1));
        vHp = _mm256_slli_si256_rpl(vHp, 4);
        vHp = _mm256_insert_epi32_rpl(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm256_sub_epi32(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm256_load_si256(pvH+i);
            vE = _mm256_load_si256(pvE+i);
            vW = _mm256_load_si256(pvW+i);
            vE = _mm256_max_epi32(
                    _mm256_sub_epi32(vE, vGapE),
                    _mm256_sub_epi32(vH, vGapO));
            vHp = _mm256_add_epi32(vHp, vW);
            vF = _mm256_max_epi32(vF, _mm256_add_epi32(vHt, pvGapper[i]));
            vHt = _mm256_max_epi32(vE, vHp);
            _mm256_store_si256(pvE+i, vE);
            _mm256_store_si256(pvHt+i, vHt);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm256_slli_si256_rpl(vHt, 4);
        vHt = _mm256_insert_epi32_rpl(vHt, boundary[j+1], 0);
        vF = _mm256_max_epi32(vF, _mm256_add_epi32(vHt, pvGapper[0]));
        for (i=0; i<segWidth-2; ++i) {
            __m256i vFt = _mm256_slli_si256_rpl(vF, 4);
            vFt = _mm256_add_epi32(vFt, vSegLenXgap);
            vF = _mm256_max_epi32(vF, vFt);
        }

        /* calculate final H */
        vF = _mm256_slli_si256_rpl(vF, 4);
        vF = _mm256_add_epi32(vF, vNegInfFront);
        vH = _mm256_max_epi32(vHt, vF);
        for (i=0; i<segLen; ++i) {
            vHt = _mm256_load_si256(pvHt+i);
            vF = _mm256_max_epi32(
                    _mm256_sub_epi32(vF, vGapE),
                    _mm256_sub_epi32(vH, vGapO));
            vH = _mm256_max_epi32(vHt, vF);
            _mm256_store_si256(pvH+i, vH);
            vSaturationCheckMin = _mm256_min_epi32(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm256_max_epi32(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
        } 


#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm256_load_si256(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 4);
            }
            result->rowcols->score_row[j] = (int32_t) _mm256_extract_epi32_rpl (vH, 7);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvH+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m256i vH = _mm256_load_si256(pvH + offset);
        for (k=0; k<position; ++k) {
            vH = _mm256_slli_si256_rpl(vH, 4);
        }
        score = (int32_t) _mm256_extract_epi32_rpl (vH, 7);
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi32_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(boundary);
    parasail_free(pvE);

    return result;
}